

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O3

void __thiscall
xLearn::DMATRIX_TEST_AddData_Test::~DMATRIX_TEST_AddData_Test(DMATRIX_TEST_AddData_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DMATRIX_TEST, AddData) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.Y[i] = 1.0;
    matrix.norm[i] = 1.0;
    matrix.AddNode(i, i, 66.66, i);
  }
  matrix.SetHash(1234, 5678);
  for (size_t i = 0; i < kLength; ++i) {
    EXPECT_EQ(matrix.row_length, kLength);
    EXPECT_FLOAT_EQ(matrix.Y[i], 1.0);
    EXPECT_FLOAT_EQ(matrix.norm[i], 1.0);
    SparseRow* row = matrix.row[i];
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->feat_id, i);
      EXPECT_EQ(iter->field_id, i);
      EXPECT_FLOAT_EQ(iter->feat_val, 66.66);
    }
  }
  EXPECT_EQ(matrix.hash_value_1, 1234);
  EXPECT_EQ(matrix.hash_value_2, 5678);
}